

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::constant_expression_vector_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t vector)

{
  ID *pIVar1;
  ConstantVector *pCVar2;
  Constant *pCVar3;
  bool bVar4;
  uint uVar5;
  SPIRType *pSVar6;
  CompilerError *pCVar7;
  bool bVar8;
  uint32_t uVar9;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong uVar10;
  ulong uVar11;
  byte bVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  uint local_46c;
  string int64_type;
  SPIRType tmp;
  string local_2f0;
  SPIRType scalar_type;
  SPIRType type;
  
  pSVar6 = Compiler::get<spirv_cross::SPIRType>
                     (&this->super_Compiler,*(uint32_t *)&(c->super_IVariant).field_0xc);
  SPIRType::SPIRType(&type,pSVar6);
  type.columns = 1;
  SPIRType::SPIRType(&scalar_type,&type);
  scalar_type.vecsize = 1;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar15 = (this->backend).use_constructor_splatting;
  uVar5 = (c->m).c[0].vecsize;
  uVar13 = (ulong)uVar5;
  bVar14 = 1 < uVar13;
  bVar8 = (bool)((this->backend).can_swizzle_scalar & bVar14 & type.super_IVariant._12_4_ - 0xc < 3)
  ;
  uVar11 = (ulong)CONCAT31((int3)(type.super_IVariant._12_4_ - 0xc >> 8),bVar8);
  bVar4 = bVar14;
  if (bVar15 == false) {
    bVar4 = bVar8;
  }
  if (bVar4 == true) {
    bVar12 = bVar14 & bVar15;
    uVar10 = 0;
    do {
      if (uVar13 == uVar10) {
        if (bVar15 != false) {
          bVar8 = 1 < uVar5;
        }
        if (bVar8 != false) goto LAB_00255245;
        break;
      }
      pIVar1 = (c->m).c[vector].id + uVar10;
      uVar10 = uVar10 + 1;
    } while (pIVar1->id == 0);
LAB_0025527a:
    bVar12 = 0;
    local_46c = 0;
  }
  else {
    bVar12 = 0;
    local_46c = 0;
    if (bVar8 != false) {
LAB_00255245:
      pCVar2 = (c->m).c + vector;
      if (type.width == 0x40) {
        uVar10 = 1;
        do {
          if (uVar13 <= uVar10) goto LAB_002552b4;
          pCVar3 = (c->m).c[vector].r + uVar10;
          uVar10 = uVar10 + 1;
        } while (pCVar2->r[0].u64 == pCVar3->u64);
        goto LAB_0025527a;
      }
      for (uVar10 = 1; uVar10 < uVar13; uVar10 = uVar10 + 1) {
        bVar15 = pCVar2->r[0].u32 != (c->m).c[vector].r[uVar10].u32;
        if (bVar15) {
          bVar12 = 0;
        }
        uVar11 = uVar11 & 0xff;
        if (bVar15) {
          uVar11 = 0;
        }
      }
LAB_002552b4:
      local_46c = (uint)uVar11;
    }
  }
  if ((1 < uVar5) && ((char)local_46c == '\0')) {
    (*(this->super_Compiler)._vptr_Compiler[0x13])(&int64_type,this,&type,0);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp,
                     &int64_type,"(");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&tmp);
    ::std::__cxx11::string::~string((string *)&int64_type);
    uVar11 = extraout_RDX;
  }
  switch(type.super_IVariant._12_4_) {
  case (BADTYPE)0x2:
    if (bVar12 == 0) {
      uVar11 = 0;
      while (uVar5 = (c->m).c[0].vecsize, uVar11 < uVar5) {
        if ((uVar5 < 2) || (uVar9 = (c->m).c[vector].id[uVar11].id, uVar9 == 0)) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else {
          to_expression_abi_cxx11_((string *)&tmp,this,uVar9,true);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&tmp);
        }
        uVar11 = uVar11 + 1;
        if (uVar11 < (c->m).c[0].vecsize) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      goto LAB_002556b0;
    }
    goto LAB_00255514;
  case (BADTYPE)0x3:
    if (bVar12 == 0) {
      uVar11 = 0;
      while (uVar5 = (c->m).c[0].vecsize, uVar11 < uVar5) {
        if ((uVar5 < 2) || (uVar9 = (c->m).c[vector].id[uVar11].id, uVar9 == 0)) {
          (*(this->super_Compiler)._vptr_Compiler[0x13])(&tmp,this,&scalar_type,0);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&tmp);
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          ::std::__cxx11::to_string((string *)&tmp,(int)*(char *)((c->m).c[vector].r + uVar11));
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&tmp);
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else {
          to_expression_abi_cxx11_((string *)&tmp,this,uVar9,true);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&tmp);
        }
        uVar11 = uVar11 + 1;
        if (uVar11 < (c->m).c[0].vecsize) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      goto LAB_002556b0;
    }
    ::std::__cxx11::to_string((string *)&tmp,(int)*(char *)(c->m).c[vector].r);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    goto LAB_002556a7;
  case (BADTYPE)0x4:
    if (bVar12 == 0) {
      uVar11 = 0;
      while (uVar5 = (c->m).c[0].vecsize, uVar11 < uVar5) {
        if ((uVar5 < 2) || (uVar9 = (c->m).c[vector].id[uVar11].id, uVar9 == 0)) {
          (*(this->super_Compiler)._vptr_Compiler[0x13])(&tmp,this,&scalar_type,0);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&tmp);
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          ::std::__cxx11::to_string((string *)&tmp,(uint)*(byte *)((c->m).c[vector].r + uVar11));
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&tmp);
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else {
          to_expression_abi_cxx11_((string *)&tmp,this,uVar9,true);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&tmp);
        }
        uVar11 = uVar11 + 1;
        if (uVar11 < (c->m).c[0].vecsize) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      goto LAB_002556b0;
    }
    ::std::__cxx11::to_string((string *)&tmp,(uint)*(byte *)(c->m).c[vector].r);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    goto LAB_002556a7;
  case (BADTYPE)0x5:
    if (bVar12 == 0) {
      uVar11 = 0;
      while (uVar5 = (c->m).c[0].vecsize, uVar11 < uVar5) {
        if ((uVar5 < 2) || (uVar9 = (c->m).c[vector].id[uVar11].id, uVar9 == 0)) {
          if (*(this->backend).int16_t_literal_suffix == '\0') {
            (*(this->super_Compiler)._vptr_Compiler[0x13])(&tmp,this,&scalar_type,0);
            ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            ::std::__cxx11::string::~string((string *)&tmp);
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            ::std::__cxx11::to_string((string *)&tmp,(int)*(short *)((c->m).c[vector].r + uVar11));
            ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            ::std::__cxx11::string::~string((string *)&tmp);
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          else {
            ::std::__cxx11::to_string((string *)&tmp,(int)*(short *)((c->m).c[vector].r + uVar11));
            ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            ::std::__cxx11::string::~string((string *)&tmp);
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        }
        else {
          to_expression_abi_cxx11_((string *)&tmp,this,uVar9,true);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&tmp);
        }
        uVar11 = uVar11 + 1;
        if (uVar11 < (c->m).c[0].vecsize) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      goto LAB_002556b0;
    }
    ::std::__cxx11::to_string((string *)&tmp,(int)*(short *)(c->m).c[vector].r);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    goto LAB_002556a7;
  case (BADTYPE)0x6:
    if (bVar12 == 0) {
      uVar11 = 0;
      while (uVar5 = (c->m).c[0].vecsize, uVar11 < uVar5) {
        if ((uVar5 < 2) || (uVar9 = (c->m).c[vector].id[uVar11].id, uVar9 == 0)) {
          if (*(this->backend).uint16_t_literal_suffix == '\0') {
            (*(this->super_Compiler)._vptr_Compiler[0x13])(&tmp,this,&scalar_type,0);
            ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            ::std::__cxx11::string::~string((string *)&tmp);
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            ::std::__cxx11::to_string((string *)&tmp,(uint)*(ushort *)((c->m).c[vector].r + uVar11))
            ;
            ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            ::std::__cxx11::string::~string((string *)&tmp);
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          else {
            ::std::__cxx11::to_string((string *)&tmp,(uint)*(ushort *)((c->m).c[vector].r + uVar11))
            ;
            ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            ::std::__cxx11::string::~string((string *)&tmp);
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        }
        else {
          to_expression_abi_cxx11_((string *)&tmp,this,uVar9,true);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&tmp);
        }
        uVar11 = uVar11 + 1;
        if (uVar11 < (c->m).c[0].vecsize) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      goto LAB_002556b0;
    }
    ::std::__cxx11::to_string((string *)&tmp,(c->m).c[vector].r[0].u32);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    goto LAB_002556a7;
  case (BADTYPE)0x7:
    if (bVar12 == 0) {
      uVar13 = 0;
      while( true ) {
        uVar9 = (uint32_t)uVar11;
        uVar5 = (c->m).c[0].vecsize;
        if (uVar5 <= uVar13) break;
        if ((uVar5 < 2) || (uVar9 = (c->m).c[vector].id[uVar13].id, uVar9 == 0)) {
          convert_to_string_abi_cxx11_
                    ((string *)&tmp,(spirv_cross *)(ulong)(c->m).c[vector].r[uVar13].u32,uVar9);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        else {
          to_expression_abi_cxx11_((string *)&tmp,this,uVar9,true);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        ::std::__cxx11::string::~string((string *)&tmp);
        uVar13 = uVar13 + 1;
        uVar11 = extraout_RDX_00;
        if (uVar13 < (c->m).c[0].vecsize) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar11 = extraout_RDX_01;
        }
      }
      goto LAB_002556b0;
    }
    convert_to_string_abi_cxx11_
              ((string *)&tmp,(spirv_cross *)(ulong)(c->m).c[vector].r[0].u32,(int32_t)uVar11);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
LAB_002556a7:
    ::std::__cxx11::string::~string((string *)&tmp);
    break;
  case (BADTYPE)0x8:
    if (bVar12 == 0) {
      uVar11 = 0;
      while (uVar5 = (c->m).c[0].vecsize, uVar11 < uVar5) {
        if ((uVar5 < 2) || (uVar9 = (c->m).c[vector].id[uVar11].id, uVar9 == 0)) {
          ::std::__cxx11::to_string((string *)&tmp,(c->m).c[vector].r[uVar11].u32);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&tmp);
          bVar15 = is_legacy(this);
          if (bVar15) {
            if ((c->m).c[vector].r[uVar11].i32 < 0) {
              pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&tmp,
                         "Tried to convert uint literal into int, but this made the literal negative."
                         ,(allocator *)&int64_type);
              CompilerError::CompilerError(pCVar7,(string *)&tmp);
              __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
          else if ((this->backend).uint32_t_literal_suffix == true) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        }
        else {
          to_expression_abi_cxx11_((string *)&tmp,this,uVar9,true);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&tmp);
        }
        uVar11 = uVar11 + 1;
        if (uVar11 < (c->m).c[0].vecsize) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      goto LAB_002556b0;
    }
    ::std::__cxx11::to_string((string *)&tmp,(c->m).c[vector].r[0].u32);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&tmp);
    bVar15 = is_legacy(this);
    if (bVar15) {
      if ((c->m).c[vector].r[0].i32 < 0) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&tmp,
                   "Tried to convert uint literal into int, but this made the literal negative.",
                   (allocator *)&int64_type);
        CompilerError::CompilerError(pCVar7,(string *)&tmp);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else if ((this->backend).uint32_t_literal_suffix != false) goto LAB_00255514;
    break;
  case (BADTYPE)0x9:
    SPIRType::SPIRType(&tmp,&type);
    tmp.vecsize = 1;
    tmp.columns = 1;
    (*(this->super_Compiler)._vptr_Compiler[0x13])(&int64_type,this,&tmp,0);
    if (bVar12 == 0) {
      uVar11 = 0;
      while (uVar5 = (c->m).c[0].vecsize, uVar11 < uVar5) {
        if ((uVar5 < 2) || (uVar9 = (c->m).c[vector].id[uVar11].id, uVar9 == 0)) {
          convert_to_string(&local_2f0,(c->m).c[vector].r[uVar11].i64,&int64_type,
                            (this->backend).long_long_literal_suffix);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        else {
          to_expression_abi_cxx11_(&local_2f0,this,uVar9,true);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        ::std::__cxx11::string::~string((string *)&local_2f0);
        uVar11 = uVar11 + 1;
        if (uVar11 < (c->m).c[0].vecsize) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
    }
    else {
      convert_to_string(&local_2f0,(c->m).c[vector].r[0].i64,&int64_type,
                        (this->backend).long_long_literal_suffix);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_2f0);
    }
    ::std::__cxx11::string::~string((string *)&int64_type);
    SPIRType::~SPIRType(&tmp);
    break;
  case (BADTYPE)0xa:
    if (bVar12 == 0) {
      uVar11 = 0;
      while (uVar5 = (c->m).c[0].vecsize, uVar11 < uVar5) {
        if ((uVar5 < 2) || (uVar9 = (c->m).c[vector].id[uVar11].id, uVar9 == 0)) {
          ::std::__cxx11::to_string((string *)&tmp,(c->m).c[vector].r[uVar11].u64);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&tmp);
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else {
          to_expression_abi_cxx11_((string *)&tmp,this,uVar9,true);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&tmp);
        }
        uVar11 = uVar11 + 1;
        if (uVar11 < (c->m).c[0].vecsize) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      goto LAB_002556b0;
    }
    ::std::__cxx11::to_string((string *)&tmp,(c->m).c[vector].r[0].u64);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&tmp);
LAB_00255514:
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  default:
    pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&tmp,"Invalid constant expression basetype.",(allocator *)&int64_type);
    CompilerError::CompilerError(pCVar7,(string *)&tmp);
    __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case (BADTYPE)0xc:
    if ((bVar12 == 0) && ((local_46c & 1) == 0)) {
      uVar11 = 0;
      while (uVar5 = (c->m).c[0].vecsize, uVar11 < uVar5) {
        if ((uVar5 < 2) || (uVar9 = (c->m).c[vector].id[uVar11].id, uVar9 == 0)) {
          convert_half_to_string_abi_cxx11_((string *)&tmp,this,c,vector,(uint32_t)uVar11);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        else {
          to_expression_abi_cxx11_((string *)&tmp,this,uVar9,true);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        ::std::__cxx11::string::~string((string *)&tmp);
        uVar11 = uVar11 + 1;
        if (uVar11 < (c->m).c[0].vecsize) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      goto LAB_002556b0;
    }
    convert_half_to_string_abi_cxx11_((string *)&tmp,this,c,vector,0);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&tmp);
    if ((local_46c & 1) != 0) {
      pSVar6 = Compiler::get<spirv_cross::SPIRType>
                         (&this->super_Compiler,*(uint32_t *)&(c->super_IVariant).field_0xc);
      remap_swizzle((string *)&tmp,this,pSVar6,1,__return_storage_ptr__);
LAB_002554ae:
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&tmp);
      goto LAB_002556a7;
    }
    break;
  case (BADTYPE)0xd:
    if ((bVar12 == 0) && ((local_46c & 1) == 0)) {
      uVar11 = 0;
      while (uVar5 = (c->m).c[0].vecsize, uVar11 < uVar5) {
        if ((uVar5 < 2) || (uVar9 = (c->m).c[vector].id[uVar11].id, uVar9 == 0)) {
          convert_float_to_string_abi_cxx11_((string *)&tmp,this,c,vector,(uint32_t)uVar11);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        else {
          to_expression_abi_cxx11_((string *)&tmp,this,uVar9,true);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        ::std::__cxx11::string::~string((string *)&tmp);
        uVar11 = uVar11 + 1;
        if (uVar11 < (c->m).c[0].vecsize) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      goto LAB_002556b0;
    }
    convert_float_to_string_abi_cxx11_((string *)&tmp,this,c,vector,0);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&tmp);
    if ((local_46c & 1) != 0) {
      pSVar6 = Compiler::get<spirv_cross::SPIRType>
                         (&this->super_Compiler,*(uint32_t *)&(c->super_IVariant).field_0xc);
      remap_swizzle((string *)&tmp,this,pSVar6,1,__return_storage_ptr__);
      goto LAB_002554ae;
    }
    break;
  case (BADTYPE)0xe:
    if ((bVar12 == 0) && ((local_46c & 1) == 0)) {
      uVar11 = 0;
      while (uVar5 = (c->m).c[0].vecsize, uVar11 < uVar5) {
        if ((uVar5 < 2) || (uVar9 = (c->m).c[vector].id[uVar11].id, uVar9 == 0)) {
          convert_double_to_string_abi_cxx11_((string *)&tmp,this,c,vector,(uint32_t)uVar11);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        else {
          to_expression_abi_cxx11_((string *)&tmp,this,uVar9,true);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        ::std::__cxx11::string::~string((string *)&tmp);
        uVar11 = uVar11 + 1;
        if (uVar11 < (c->m).c[0].vecsize) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      goto LAB_002556b0;
    }
    convert_double_to_string_abi_cxx11_((string *)&tmp,this,c,vector,0);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&tmp);
    if ((local_46c & 1) != 0) {
      pSVar6 = Compiler::get<spirv_cross::SPIRType>
                         (&this->super_Compiler,*(uint32_t *)&(c->super_IVariant).field_0xc);
      remap_swizzle((string *)&tmp,this,pSVar6,1,__return_storage_ptr__);
      goto LAB_002554ae;
    }
  }
  uVar5 = (c->m).c[0].vecsize;
LAB_002556b0:
  if ((1 < uVar5) && ((local_46c & 1) == 0)) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  SPIRType::~SPIRType(&scalar_type);
  SPIRType::~SPIRType(&type);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::constant_expression_vector(const SPIRConstant &c, uint32_t vector)
{
	auto type = get<SPIRType>(c.constant_type);
	type.columns = 1;

	auto scalar_type = type;
	scalar_type.vecsize = 1;

	string res;
	bool splat = backend.use_constructor_splatting && c.vector_size() > 1;
	bool swizzle_splat = backend.can_swizzle_scalar && c.vector_size() > 1;

	if (!type_is_floating_point(type))
	{
		// Cannot swizzle literal integers as a special case.
		swizzle_splat = false;
	}

	if (splat || swizzle_splat)
	{
		// Cannot use constant splatting if we have specialization constants somewhere in the vector.
		for (uint32_t i = 0; i < c.vector_size(); i++)
		{
			if (c.specialization_constant_id(vector, i) != 0)
			{
				splat = false;
				swizzle_splat = false;
				break;
			}
		}
	}

	if (splat || swizzle_splat)
	{
		if (type.width == 64)
		{
			uint64_t ident = c.scalar_u64(vector, 0);
			for (uint32_t i = 1; i < c.vector_size(); i++)
			{
				if (ident != c.scalar_u64(vector, i))
				{
					splat = false;
					swizzle_splat = false;
					break;
				}
			}
		}
		else
		{
			uint32_t ident = c.scalar(vector, 0);
			for (uint32_t i = 1; i < c.vector_size(); i++)
			{
				if (ident != c.scalar(vector, i))
				{
					splat = false;
					swizzle_splat = false;
				}
			}
		}
	}

	if (c.vector_size() > 1 && !swizzle_splat)
		res += type_to_glsl(type) + "(";

	switch (type.basetype)
	{
	case SPIRType::Half:
		if (splat || swizzle_splat)
		{
			res += convert_half_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_half_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Float:
		if (splat || swizzle_splat)
		{
			res += convert_float_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_float_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Double:
		if (splat || swizzle_splat)
		{
			res += convert_double_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_double_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Int64:
	{
		auto tmp = type;
		tmp.vecsize = 1;
		tmp.columns = 1;
		auto int64_type = type_to_glsl(tmp);

		if (splat)
		{
			res += convert_to_string(c.scalar_i64(vector, 0), int64_type, backend.long_long_literal_suffix);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_to_string(c.scalar_i64(vector, i), int64_type, backend.long_long_literal_suffix);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;
	}

	case SPIRType::UInt64:
		if (splat)
		{
			res += convert_to_string(c.scalar_u64(vector, 0));
			if (backend.long_long_literal_suffix)
				res += "ull";
			else
				res += "ul";
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += convert_to_string(c.scalar_u64(vector, i));
					if (backend.long_long_literal_suffix)
						res += "ull";
					else
						res += "ul";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UInt:
		if (splat)
		{
			res += convert_to_string(c.scalar(vector, 0));
			if (is_legacy())
			{
				// Fake unsigned constant literals with signed ones if possible.
				// Things like array sizes, etc, tend to be unsigned even though they could just as easily be signed.
				if (c.scalar_i32(vector, 0) < 0)
					SPIRV_CROSS_THROW("Tried to convert uint literal into int, but this made the literal negative.");
			}
			else if (backend.uint32_t_literal_suffix)
				res += "u";
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += convert_to_string(c.scalar(vector, i));
					if (is_legacy())
					{
						// Fake unsigned constant literals with signed ones if possible.
						// Things like array sizes, etc, tend to be unsigned even though they could just as easily be signed.
						if (c.scalar_i32(vector, i) < 0)
							SPIRV_CROSS_THROW("Tried to convert uint literal into int, but this made "
							                  "the literal negative.");
					}
					else if (backend.uint32_t_literal_suffix)
						res += "u";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Int:
		if (splat)
			res += convert_to_string(c.scalar_i32(vector, 0));
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_to_string(c.scalar_i32(vector, i));
				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UShort:
		if (splat)
		{
			res += convert_to_string(c.scalar(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					if (*backend.uint16_t_literal_suffix)
					{
						res += convert_to_string(c.scalar_u16(vector, i));
						res += backend.uint16_t_literal_suffix;
					}
					else
					{
						// If backend doesn't have a literal suffix, we need to value cast.
						res += type_to_glsl(scalar_type);
						res += "(";
						res += convert_to_string(c.scalar_u16(vector, i));
						res += ")";
					}
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Short:
		if (splat)
		{
			res += convert_to_string(c.scalar_i16(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					if (*backend.int16_t_literal_suffix)
					{
						res += convert_to_string(c.scalar_i16(vector, i));
						res += backend.int16_t_literal_suffix;
					}
					else
					{
						// If backend doesn't have a literal suffix, we need to value cast.
						res += type_to_glsl(scalar_type);
						res += "(";
						res += convert_to_string(c.scalar_i16(vector, i));
						res += ")";
					}
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UByte:
		if (splat)
		{
			res += convert_to_string(c.scalar_u8(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += type_to_glsl(scalar_type);
					res += "(";
					res += convert_to_string(c.scalar_u8(vector, i));
					res += ")";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::SByte:
		if (splat)
		{
			res += convert_to_string(c.scalar_i8(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += type_to_glsl(scalar_type);
					res += "(";
					res += convert_to_string(c.scalar_i8(vector, i));
					res += ")";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Boolean:
		if (splat)
			res += c.scalar(vector, 0) ? "true" : "false";
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += c.scalar(vector, i) ? "true" : "false";

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	default:
		SPIRV_CROSS_THROW("Invalid constant expression basetype.");
	}

	if (c.vector_size() > 1 && !swizzle_splat)
		res += ")";

	return res;
}